

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O3

void GC::PrintMarker(markerType marker)

{
  if ((marker & 2) == 0) {
    return;
  }
  __assert_fail("!\"reached a freed pointer\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_Common.cpp"
                ,0x2e5,"void GC::PrintMarker(markerType)");
}

Assistant:

void PrintMarker(markerType marker)
	{
		GC_DEBUG_PRINT("\tMarker is 0x%2x [", unsigned(marker));

		if(marker & OBJECT_VISIBLE)
		{
			GC_DEBUG_PRINT("visible");
		}
		else
		{
			GC_DEBUG_PRINT("unmarked");
		}

		if(marker & OBJECT_FREED)
		{
			GC_DEBUG_PRINT(" freed]\n");

			assert(!"reached a freed pointer");
			return;
		}

		if(marker & OBJECT_FINALIZABLE)
			GC_DEBUG_PRINT(" finalizable");

		if(marker & OBJECT_FINALIZED)
			GC_DEBUG_PRINT(" finalized");

		if(marker & OBJECT_ARRAY)
			GC_DEBUG_PRINT(" array");

		GC_DEBUG_PRINT("] type %d '%s'\n", unsigned(marker >> 8), NULLC::commonLinker->exSymbols.data + NULLC::commonLinker->exTypes[unsigned(marker >> 8)].offsetToName);
	}